

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O1

int dumbfile_close(DUMBFILE *f)

{
  long lVar1;
  _func_void_void_ptr *p_Var2;
  
  lVar1 = f->pos;
  p_Var2 = f->dfs->close;
  if (p_Var2 != (_func_void_void_ptr *)0x0) {
    (*p_Var2)(f->file);
  }
  free(f);
  return (int)((ulong)lVar1 >> 0x3f);
}

Assistant:

int DUMBEXPORT dumbfile_close(DUMBFILE *f)
{
	int rv;

	ASSERT(f);

	rv = f->pos < 0;

	if (f->dfs->close)
		(*f->dfs->close)(f->file);

	free(f);

	return rv;
}